

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::
InitializeableArray(InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *this,
                   initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init)

{
  size_type in_RCX;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_00;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_38;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *local_20;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *this_local;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_local;
  
  init_00._M_array = (iterator)init._M_len;
  this_local = (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)init._M_array;
  init_00._M_len = in_RCX;
  local_20 = this;
  init_local._M_array = init_00._M_array;
  heapArray<kj::(anonymous_namespace)::HeaderTestCase>(&local_38,(kj *)this_local,init_00);
  Array<kj::(anonymous_namespace)::HeaderTestCase>::Array
            (&this->super_Array<kj::(anonymous_namespace)::HeaderTestCase>,&local_38);
  Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_38);
  return;
}

Assistant:

InitializeableArray(std::initializer_list<T> init)
      : Array<T>(kj::heapArray(init)) {}